

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx512_harvey_seal(uint16_t *data,uint32_t len,uint32_t *flags)

{
  int iVar1;
  uint32_t *in_stack_000007f8;
  uint32_t in_stack_00000804;
  uint16_t *in_stack_00000808;
  
  iVar1 = pospopcnt_u16_avx512bw_harvey_seal(in_stack_00000808,in_stack_00000804,in_stack_000007f8);
  return iVar1;
}

Assistant:

int pospopcnt_u16_avx512_harvey_seal(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    #if defined(__AVX512BW__) && __AVX512BW__ == 1
    return pospopcnt_u16_avx512bw_harvey_seal(data, len, flags);
    #elif defined(__AVX512VBMI__) && __AVX512VBMI__ == 1
    return pospopcnt_u16_avx512vbmi_harvey_seal(data, len, flags);
    #else
    return(0);
    #endif
}